

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O0

HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> * __thiscall
Qentem::
HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
::allocate(HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
           *this,SizeT new_capacity)

{
  SizeT SVar1;
  char *value;
  uint *ptr;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *pHVar2;
  SizeT *ht;
  SizeT size_sum;
  SizeT32 size;
  SizeT new_capacity_local;
  HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
  *this_local;
  
  SVar1 = Memory::AlignSize((new_capacity & 1) + new_capacity);
  setCapacity(this,SVar1);
  value = Memory::Allocate<char>(SVar1 * 0x34);
  ptr = Memory::ChangePointer<unsigned_int>(value);
  setHashTable(this,ptr);
  Memory::SetToZero<unsigned_int>(ptr,SVar1 << 2);
  SVar1 = Capacity(this);
  pHVar2 = Memory::ChangePointer<Qentem::HAItem_T<Qentem::String<char16_t>,Qentem::Value<char16_t>>>
                     (ptr + SVar1);
  return pHVar2;
}

Assistant:

HItem *allocate(SizeT new_capacity) {
        constexpr SizeT32 size     = sizeof(SizeT);
        constexpr SizeT   size_sum = SizeT{size + sizeof(HItem)};

        // Making sure 'size' is not an odd number.
        new_capacity += (new_capacity & SizeT{1});
        new_capacity = Memory::AlignSize(new_capacity);

        setCapacity(new_capacity);

        SizeT *ht = Memory::ChangePointer<SizeT>(Memory::Allocate<char>((size_sum * new_capacity)));

        setHashTable(ht);

        Memory::SetToZero(ht, (size * new_capacity));

        return Memory::ChangePointer<HItem>(ht + Capacity());
    }